

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O3

TimingControl * __thiscall
slang::ast::PrimitiveInstanceSymbol::getDelay(PrimitiveInstanceSymbol *this)

{
  Scope *pSVar1;
  SyntaxNode *pSVar2;
  SourceLocation SVar3;
  TimingControl *pTVar4;
  _Storage<const_slang::ast::TimingControl_*,_true> _Var5;
  bool bVar6;
  LookupLocation LVar7;
  ASTContext context;
  ASTContext local_50;
  undefined4 extraout_var;
  
  if ((this->delay).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>._M_payload.
      super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_engaged == true) {
LAB_0023f2fe:
    return (this->delay).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>.
           _M_payload.super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_payload.
           _M_value;
  }
  pSVar1 = (this->super_InstanceSymbolBase).super_Symbol.parentScope;
  pSVar2 = (this->super_InstanceSymbolBase).super_Symbol.originatingSyntax;
  if ((pSVar2 != (SyntaxNode *)0x0 && pSVar1 != (Scope *)0x0) &&
     (pSVar2->parent != (SyntaxNode *)0x0)) {
    LVar7 = LookupLocation::before((Symbol *)this);
    local_50.lookupIndex = LVar7.index;
    local_50.flags.m_bits = 0x20;
    local_50.instanceOrProc = (Symbol *)0x0;
    local_50.firstTempVar = (TempVarSymbol *)0x0;
    local_50.randomizeDetails = (RandomizeDetails *)0x0;
    local_50.assertionInstance = (AssertionInstanceDetails *)0x0;
    pSVar2 = pSVar2->parent;
    local_50.scope.ptr = pSVar1;
    if (pSVar2->kind == HierarchyInstantiation) {
      if (*(ParameterValueAssignmentSyntax **)(pSVar2 + 4) != (ParameterValueAssignmentSyntax *)0x0)
      {
        pTVar4 = Delay3Control::fromParams
                           (pSVar1->compilation,*(ParameterValueAssignmentSyntax **)(pSVar2 + 4),
                            &local_50);
        bVar6 = (this->delay).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>.
                _M_payload.super__Optional_payload_base<const_slang::ast::TimingControl_*>.
                _M_engaged == false;
        if (bVar6) {
          (this->delay).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>.
          _M_payload.super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_engaged =
               true;
          (this->delay).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>.
          _M_payload.super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_payload.
          _M_value = pTVar4;
        }
        else {
          (this->delay).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>.
          _M_payload.super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_payload.
          _M_value = pTVar4;
          if (bVar6) {
            std::__throw_bad_optional_access();
          }
        }
        if (pTVar4->kind != Delay3) {
          return pTVar4;
        }
        SVar3 = pTVar4[1].sourceRange.startLoc;
        if (SVar3 == (SourceLocation)0x0) {
          return pTVar4;
        }
        ASTContext::addDiag(&local_50,(DiagCode)0x1d0005,*(SourceRange *)((long)SVar3 + 0x20));
        goto LAB_0023f2fe;
      }
    }
    else if (pSVar2[4].parent != (SyntaxNode *)0x0) {
      _Var5._0_4_ = TimingControl::bind((int)pSVar2[4].parent,(sockaddr *)&local_50,
                                        local_50.lookupIndex);
      _Var5._4_4_ = extraout_var;
      if ((this->delay).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>.
          _M_payload.super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_engaged ==
          false) {
        (this->delay).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>._M_payload
        .super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_engaged = true;
      }
      (this->delay).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>._M_payload.
      super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_payload = _Var5;
      return _Var5._M_value;
    }
    if ((this->delay).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>._M_payload
        .super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_engaged != false)
    goto LAB_0023f3b5;
  }
  (this->delay).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>._M_payload.
  super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_engaged = true;
LAB_0023f3b5:
  (this->delay).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>._M_payload.
  super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_payload._M_value =
       (TimingControl *)0x0;
  return (TimingControl *)0x0;
}

Assistant:

const TimingControl* PrimitiveInstanceSymbol::getDelay() const {
    if (delay)
        return *delay;

    auto scope = getParentScope();
    auto syntax = getSyntax();
    if (!scope || !syntax || !syntax->parent) {
        delay = nullptr;
        return nullptr;
    }

    ASTContext context(*scope, LookupLocation::before(*this), ASTFlags::NonProcedural);

    auto& parent = *syntax->parent;
    if (parent.kind == SyntaxKind::HierarchyInstantiation) {
        if (auto params = parent.as<HierarchyInstantiationSyntax>().parameters) {
            delay = &Delay3Control::fromParams(scope->getCompilation(), *params, context);
            if (delay.value()->kind == TimingControlKind::Delay3) {
                if (auto d3 = delay.value()->as<Delay3Control>().expr3)
                    context.addDiag(diag::Delay3UdpNotAllowed, d3->sourceRange);
            }
            return *delay;
        }
    }
    else {
        auto delaySyntax = parent.as<PrimitiveInstantiationSyntax>().delay;
        if (delaySyntax) {
            delay = &TimingControl::bind(*delaySyntax, context);
            return *delay;
        }
    }

    delay = nullptr;
    return nullptr;
}